

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O2

void recompute_shading_normals(mesh *mesh)

{
  float fVar1;
  undefined8 uVar2;
  mesh_type mVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  real_t *prVar13;
  bool bVar14;
  vec3 vVar15;
  
  pvVar4 = mesh->attrs[1].data;
  pvVar5 = mesh->attrs[2].data;
  mVar3 = mesh->type;
  puVar7 = (undefined4 *)((long)pvVar4 + 8);
  for (uVar8 = 0; uVar8 < mesh->vertex_count; uVar8 = uVar8 + 1) {
    *(undefined8 *)(puVar7 + -2) = 0;
    *puVar7 = 0;
    puVar7 = puVar7 + 3;
  }
  lVar6 = 4 - (ulong)(mVar3 == TRI_MESH);
  lVar9 = 0;
  for (uVar8 = 0; uVar8 < mesh->primitive_count; uVar8 = uVar8 + 1) {
    uVar2 = *(undefined8 *)((long)pvVar5 + uVar8 * 0xc);
    fVar1 = *(float *)((long)pvVar5 + uVar8 * 0xc + 8);
    lVar10 = lVar9;
    lVar11 = lVar6;
    while (bVar14 = lVar11 != 0, lVar11 = lVar11 + -1, bVar14) {
      lVar12 = *(long *)((long)mesh->indices + lVar10) * 0xc;
      *(ulong *)((long)pvVar4 + lVar12) =
           CONCAT44((float)((ulong)*(undefined8 *)((long)pvVar4 + lVar12) >> 0x20) +
                    (float)((ulong)uVar2 >> 0x20),
                    (float)*(undefined8 *)((long)pvVar4 + lVar12) + (float)uVar2);
      *(float *)((long)pvVar4 + lVar12 + 8) = *(float *)((long)pvVar4 + lVar12 + 8) + fVar1;
      lVar10 = lVar10 + 8;
    }
    lVar9 = lVar9 + (ulong)(uint)((int)lVar6 * 8);
  }
  prVar13 = (real_t *)((long)pvVar4 + 8);
  for (uVar8 = 0; uVar8 < mesh->vertex_count; uVar8 = uVar8 + 1) {
    vVar15._[2] = *prVar13;
    vVar15._._0_8_ = *(undefined8 *)(prVar13 + -2);
    vVar15 = normalize_vec3(vVar15);
    *(long *)(prVar13 + -2) = vVar15._._0_8_;
    *prVar13 = vVar15._[2];
    prVar13 = prVar13 + 3;
  }
  return;
}

Assistant:

void recompute_shading_normals(struct mesh* mesh) {
    const struct vec3* geometry_normals = mesh->attrs[ATTR_GEOMETRY_NORMAL].data;
    struct vec3* normals = mesh->attrs[ATTR_SHADING_NORMAL].data;
    size_t index_stride = mesh->type == TRI_MESH ? 3 : 4;
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = const_vec3(0);
    for (size_t i = 0; i < mesh->primitive_count; i++) {
        const struct vec3 geometry_normal = geometry_normals[i];
        for (size_t j = 0; j < index_stride; ++j) {
            size_t k = mesh->indices[i * index_stride + j];
            normals[k] = add_vec3(normals[k], geometry_normal);
        }
    }
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = normalize_vec3(normals[i]);
}